

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# int128.cc
# Opt level: O1

void __thiscall absl::uint128::uint128(uint128 *this,float v)

{
  uint64_t uVar1;
  float fVar2;
  
  if ((-1.0 < v) && ((uint)ABS(v) < 0x7f800000)) {
    fVar2 = ldexpf(1.0,0x40);
    if (fVar2 <= v) {
      fVar2 = ldexpf(v,-0x40);
      uVar1 = (long)(fVar2 - 9.223372e+18) & (long)fVar2 >> 0x3f | (long)fVar2;
      fVar2 = ldexpf((float)uVar1,0x40);
      v = v - fVar2;
    }
    else {
      uVar1 = 0;
    }
    this->lo_ = (long)(v - 9.223372e+18) & (long)v >> 0x3f | (long)v;
    this->hi_ = uVar1;
    return;
  }
  __assert_fail("std::isfinite(v) && v > -1 && (std::numeric_limits<T>::max_exponent <= 128 || v < std::ldexp(static_cast<T>(1), 128))"
                ,
                "/workspace/llm4binary/github/license_c_cmakelists/MW55[P]DNA-Aeon/abseil-cpp/absl/numeric/int128.cc"
                ,0x67,"uint128 absl::(anonymous namespace)::MakeUint128FromFloat(T) [T = float]");
}

Assistant:

uint128::uint128(float v) : uint128(MakeUint128FromFloat(v)) {}